

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

bool __thiscall
cmOutputRequiredFilesCommand::InitialPass
          (cmOutputRequiredFilesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  char *pcVar2;
  cmDependInformation *info;
  FILE *__stream;
  bool bVar3;
  allocator local_289;
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  visited;
  cmLBDepend md;
  
  bVar1 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0032,
                     "The output_required_files command should not be called; see CMP0032.");
  bVar3 = true;
  if (!bVar1) {
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x40) {
      std::__cxx11::string::_M_assign((string *)&this->File);
      std::__cxx11::string::_M_assign((string *)&this->OutputFile);
      cmLBDepend::cmLBDepend((cmLBDepend *)&md.super_cmMakeDepend);
      cmMakeDepend::SetMakefile(&md.super_cmMakeDepend,(this->super_cmCommand).Makefile);
      pcVar2 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&visited,pcVar2,&local_289);
      cmMakeDepend::AddSearchPath(&md.super_cmMakeDepend,(string *)&visited);
      std::__cxx11::string::~string((string *)&visited);
      info = cmMakeDepend::FindDependencies(&md.super_cmMakeDepend,(this->File)._M_dataplus._M_p);
      bVar3 = true;
      if (info != (cmDependInformation *)0x0) {
        std::__cxx11::string::string
                  ((string *)&visited,(this->OutputFile)._M_dataplus._M_p,&local_289);
        __stream = (FILE *)cmsys::SystemTools::Fopen((string *)&visited,"w");
        std::__cxx11::string::~string((string *)&visited);
        if (__stream == (FILE *)0x0) {
          std::__cxx11::string::string((string *)&visited,"Can not open output file: ",&local_289);
          std::__cxx11::string::append((string *)&visited);
          cmCommand::SetError(&this->super_cmCommand,(string *)&visited);
          std::__cxx11::string::~string((string *)&visited);
          bVar3 = false;
        }
        else {
          visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &visited._M_t._M_impl.super__Rb_tree_header._M_header;
          visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ListDependencies(this,info,(FILE *)__stream,&visited);
          fclose(__stream);
          std::
          _Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          ::~_Rb_tree(&visited._M_t);
        }
      }
      cmMakeDepend::~cmMakeDepend(&md.super_cmMakeDepend);
    }
    else {
      std::__cxx11::string::string
                ((string *)&md,"called with incorrect number of arguments",(allocator *)&visited);
      cmCommand::SetError(&this->super_cmCommand,(string *)&md);
      std::__cxx11::string::~string((string *)&md);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmOutputRequiredFilesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0032,
      "The output_required_files command should not be called; see CMP0032."))
    { return true; }
  if(args.size() != 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // store the arg for final pass
  this->File = args[0];
  this->OutputFile = args[1];

  // compute the list of files
  cmLBDepend md;
  md.SetMakefile(this->Makefile);
  md.AddSearchPath(this->Makefile->GetCurrentSourceDirectory());
  // find the depends for a file
  const cmDependInformation *info = md.FindDependencies(this->File.c_str());
  if (info)
    {
    // write them out
    FILE *fout = cmsys::SystemTools::Fopen(this->OutputFile.c_str(),"w");
    if(!fout)
      {
      std::string err = "Can not open output file: ";
      err += this->OutputFile;
      this->SetError(err);
      return false;
      }
    std::set<cmDependInformation const*> visited;
    this->ListDependencies(info,fout, &visited);
    fclose(fout);
    }

  return true;
}